

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

void Abc_FrameReplaceCex(Abc_Frame_t *pAbc,Abc_Cex_t **ppCex)

{
  Vec_Ptr_t *__ptr;
  int iVar1;
  long lVar2;
  
  if (pAbc->pCex != (Abc_Cex_t *)0x0) {
    free(pAbc->pCex);
    pAbc->pCex = (Abc_Cex_t *)0x0;
  }
  pAbc->pCex = *ppCex;
  *ppCex = (Abc_Cex_t *)0x0;
  __ptr = pAbc->vCexVec;
  if (__ptr != (Vec_Ptr_t *)0x0) {
    iVar1 = __ptr->nSize;
    if (0 < iVar1) {
      lVar2 = 0;
      do {
        if ((void *)0x2 < __ptr->pArray[lVar2]) {
          free(__ptr->pArray[lVar2]);
          iVar1 = __ptr->nSize;
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 < iVar1);
    }
    if (__ptr->pArray != (void **)0x0) {
      free(__ptr->pArray);
    }
    free(__ptr);
    pAbc->vCexVec = (Vec_Ptr_t *)0x0;
  }
  return;
}

Assistant:

void Abc_FrameReplaceCex( Abc_Frame_t * pAbc, Abc_Cex_t ** ppCex )
{
    // update CEX
    ABC_FREE( pAbc->pCex );
    pAbc->pCex = *ppCex;
    *ppCex = NULL;
    // remove CEX vector
    if ( pAbc->vCexVec )
    {
        Vec_PtrFreeFree( pAbc->vCexVec );
        pAbc->vCexVec = NULL;
    }
}